

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fSamplerStateQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::SamplerStateQueryTests::init
          (SamplerStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  QueryType queryType;
  TestContext *testCtx;
  RenderContext *renderCtx;
  bool bVar1;
  anon_struct_24_3_b27fdac0 *paVar2;
  bool bVar3;
  long *plVar4;
  TestNode *node;
  long lVar5;
  long *plVar6;
  size_type *psVar7;
  allocator<char> local_c9;
  anon_struct_24_3_b27fdac0 *local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  string local_a0;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  long local_60;
  char *local_58;
  string local_50;
  
  local_60 = 0;
  do {
    local_c8 = init::states + local_60;
    local_58 = local_c8->name;
    lVar5 = 0;
    bVar3 = true;
    do {
      bVar1 = bVar3;
      queryType = gles31::Functional::SamplerStateQueryTests::init()::nonPureVerifiers[lVar5];
      testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
      renderCtx = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
      local_80 = &local_70;
      local_78 = 0;
      local_70 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
      local_c0 = &local_b0;
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_b0 = *plVar6;
        lStack_a8 = plVar4[3];
      }
      else {
        local_b0 = *plVar6;
        local_c0 = (long *)*plVar4;
      }
      local_b8 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_c0);
      paVar2 = local_c8;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_a0.field_2._M_allocated_capacity = *psVar7;
        local_a0.field_2._8_8_ = plVar4[3];
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar7;
        local_a0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_a0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,local_c8->desc,&local_c9);
      node = &deqp::gls::TextureStateQueryTests::createSamplerParamTest
                        (testCtx,renderCtx,&local_a0,&local_50,queryType,paVar2->tester)->
              super_TestNode;
      tcu::TestNode::addChild((TestNode *)this,node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
      if (local_80 != &local_70) {
        operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
      }
      lVar5 = 1;
      bVar3 = false;
    } while (bVar1);
    local_60 = local_60 + 1;
  } while (local_60 != 9);
  return 9;
}

Assistant:

void SamplerStateQueryTests::init (void)
{
	using namespace gls::TextureStateQueryTests;

	static const QueryType verifiers[] =
	{
		QUERY_SAMPLER_PARAM_INTEGER,
		QUERY_SAMPLER_PARAM_FLOAT
	};
	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	tester;
	} states[] =
	{
		{ "sampler_texture_wrap_s",				"TEXTURE_WRAP_S",			TESTER_TEXTURE_WRAP_S			},
		{ "sampler_texture_wrap_t",				"TEXTURE_WRAP_T",			TESTER_TEXTURE_WRAP_T			},
		{ "sampler_texture_wrap_r",				"TEXTURE_WRAP_R",			TESTER_TEXTURE_WRAP_R			},
		{ "sampler_texture_mag_filter",			"TEXTURE_MAG_FILTER",		TESTER_TEXTURE_MAG_FILTER		},
		{ "sampler_texture_min_filter",			"TEXTURE_MIN_FILTER",		TESTER_TEXTURE_MIN_FILTER		},
		{ "sampler_texture_min_lod",			"TEXTURE_MIN_LOD",			TESTER_TEXTURE_MIN_LOD			},
		{ "sampler_texture_max_lod",			"TEXTURE_MAX_LOD",			TESTER_TEXTURE_MAX_LOD			},
		{ "sampler_texture_compare_mode",		"TEXTURE_COMPARE_MODE",		TESTER_TEXTURE_COMPARE_MODE		},
		{ "sampler_texture_compare_func",		"TEXTURE_COMPARE_FUNC",		TESTER_TEXTURE_COMPARE_FUNC		},
	};

	for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(states); ++stateNdx)
	{
		FOR_EACH_VERIFIER(verifiers, addChild(createSamplerParamTest(m_testCtx,
																	 m_context.getRenderContext(),
																	 std::string() + states[stateNdx].name + getVerifierSuffix(verifier),
																	 states[stateNdx].desc,
																	 verifier,
																	 states[stateNdx].tester)));
	}
}